

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

int Wlc_ObjCheckIsEmpty_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t WVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pObj_00;
  uint uVar4;
  
  WVar1 = *pObj;
  uVar4 = 1;
  if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) != (undefined1  [24])0x0)
  {
    if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x1) {
      iVar2 = Vec_IntEntry(&p->vRefs,(int)(((long)pObj - (long)p->pObjs) / 0x18));
      uVar4 = (uint)(iVar2 == 0);
    }
    else {
      if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1) {
        iVar2 = 0;
        do {
          if ((int)pObj->nFanins <= iVar2) {
            return 1;
          }
          iVar3 = Wlc_ObjFaninId(pObj,iVar2);
          pObj_00 = Wlc_NtkObj(p,iVar3);
          iVar3 = Wlc_ObjCheckIsEmpty_rec(p,pObj_00);
          iVar2 = iVar2 + 1;
        } while (iVar3 != 0);
      }
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

int Wlc_ObjCheckIsEmpty_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    int k, iFanin;
    if ( Wlc_ObjType(pObj) == 0 )
        return 1;
    if ( Wlc_ObjIsPi(pObj) )
        return Vec_IntEntry(&p->vRefs, Wlc_ObjId(p, pObj)) == 0;
    else if ( Wlc_ObjIsCi(pObj) )
        return 0;
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        if ( !Wlc_ObjCheckIsEmpty_rec(p, Wlc_NtkObj(p, iFanin)) )
            return 0;
    return 1;
}